

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

int enet_protocol_handle_send_fragment
              (ENetHost *host,ENetPeer *peer,ENetProtocol *command,enet_uint8 **currentData)

{
  uint *puVar1;
  ushort uVar2;
  uint uVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  enet_uint8 *peVar7;
  ENetIncomingCommand *pEVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ENetIncomingCommand *pEVar12;
  char cVar13;
  ushort uVar14;
  uint uVar15;
  ushort uVar16;
  ENetChannel *channel;
  bool bVar17;
  ENetProtocol hostCommand;
  ENetProtocol local_68;
  ulong dataLength;
  
  if (((ulong)(command->header).channelID < peer->channelCount) &&
     (peer->state - ENET_PEER_STATE_CONNECTED < 2)) {
    uVar2 = (command->acknowledge).receivedSentTime;
    uVar5 = uVar2 << 8 | uVar2 >> 8;
    peVar7 = *currentData + uVar5;
    *currentData = peVar7;
    if ((uVar2 != 0) &&
       ((((ulong)uVar5 <= host->maximumPacketSize && (host->receivedData <= peVar7)) &&
        (peVar7 <= host->receivedData + host->receivedDataLength)))) {
      uVar11 = (ulong)((uint)(command->header).channelID * 0x50);
      uVar4 = (command->acknowledge).receivedReliableSequenceNumber << 8;
      uVar16 = uVar4 | (command->acknowledge).receivedReliableSequenceNumber >> 8;
      uVar4 = uVar4 >> 0xc;
      uVar2 = *(ushort *)((long)peer->channels->reliableWindows + uVar11 + 0x20);
      uVar14 = uVar4 + 0x10;
      if (uVar2 <= uVar16) {
        uVar14 = uVar4;
      }
      if (uVar14 < uVar2 >> 0xc) {
        return 0;
      }
      if ((ushort)((uVar2 >> 0xc) + 7) <= uVar14) {
        return 0;
      }
      uVar15 = (command->connect).mtu;
      uVar3 = (command->connect).windowSize;
      uVar10 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      uVar15 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18;
      if (uVar10 < uVar15 && uVar15 < 0x100001) {
        uVar9 = (command->connect).incomingBandwidth;
        uVar6 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
        uVar9 = (command->connect).channelCount;
        uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
        dataLength = (ulong)uVar9;
        if ((((uint)uVar5 <= uVar9 - uVar6) && (uVar6 < uVar9)) &&
           ((uVar15 <= uVar9 && (dataLength <= host->maximumPacketSize)))) {
          channel = (ENetChannel *)((long)peer->channels->reliableWindows + (uVar11 - 6));
          pEVar12 = (ENetIncomingCommand *)(channel->incomingReliableCommands).sentinel.previous;
          pEVar8 = (ENetIncomingCommand *)0x0;
          do {
            if (pEVar12 == (ENetIncomingCommand *)&channel->incomingReliableCommands) {
LAB_001087db:
              if (pEVar8 == (ENetIncomingCommand *)0x0) {
                local_68._8_4_ = *(enet_uint32 *)((long)command + 8);
                local_68._12_4_ = *(enet_uint32 *)((long)command + 0xc);
                local_68._16_4_ = *(enet_uint32 *)((long)command + 0x10);
                local_68._20_4_ = *(enet_uint32 *)((long)command + 0x14);
                local_68._24_4_ = *(enet_uint32 *)((long)command + 0x18);
                local_68._28_4_ = *(enet_uint32 *)((long)command + 0x1c);
                local_68._32_4_ = *(enet_uint32 *)((long)command + 0x20);
                local_68._36_4_ = *(enet_uint32 *)((long)command + 0x24);
                local_68._40_4_ = *(enet_uint32 *)((long)command + 0x28);
                local_68._44_4_ = *(enet_uint32 *)((long)command + 0x2c);
                local_68.disconnect.data = (command->disconnect).data;
                local_68._0_2_ = (command->disconnect).header;
                local_68.header.reliableSequenceNumber = uVar16;
                pEVar8 = enet_peer_queue_incoming_command
                                   (peer,&local_68,(void *)0x0,dataLength,1,uVar15);
                if (pEVar8 == (ENetIncomingCommand *)0x0) {
                  return -1;
                }
              }
              uVar10 = uVar10 >> 5;
              if ((pEVar8->fragments[uVar10] >> (uVar3 >> 0x18 & 0x1f) & 1) == 0) {
                pEVar8->fragmentsRemaining = pEVar8->fragmentsRemaining - 1;
                puVar1 = pEVar8->fragments + uVar10;
                *puVar1 = *puVar1 | 1 << ((byte)(uVar3 >> 0x18) & 0x1f);
                uVar11 = pEVar8->packet->dataLength;
                uVar15 = (int)uVar11 - uVar6;
                if (uVar6 + uVar5 <= uVar11) {
                  uVar15 = (uint)uVar5;
                }
                memcpy(pEVar8->packet->data + uVar6,&(command->connect).outgoingBandwidth,
                       (ulong)uVar15);
                if (pEVar8->fragmentsRemaining == 0) {
                  enet_peer_dispatch_incoming_reliable_commands
                            (peer,channel,(ENetIncomingCommand *)0x0);
                  return 0;
                }
                return 0;
              }
              return 0;
            }
            if (uVar16 < uVar2) {
              cVar13 = '\x02';
              if (pEVar12->reliableSequenceNumber < uVar2) {
LAB_0010877b:
                cVar13 = '\0';
                uVar4 = pEVar12->reliableSequenceNumber;
                if (((uVar16 > uVar4 || uVar4 == uVar16) && (cVar13 = '\x02', uVar16 <= uVar4)) &&
                   ((cVar13 = '\x01', ((pEVar12->command).header.command & 0xf) == 8 &&
                    (pEVar12->packet->dataLength == dataLength)))) {
                  bVar17 = uVar15 == pEVar12->fragmentCount;
                  if (bVar17) {
                    pEVar8 = pEVar12;
                  }
                  cVar13 = bVar17 + '\x01';
                }
              }
            }
            else {
              cVar13 = '\x04';
              if (uVar2 <= pEVar12->reliableSequenceNumber) goto LAB_0010877b;
            }
            if ((cVar13 != '\0') && (cVar13 != '\x04')) {
              if (cVar13 != '\x02') {
                return -1;
              }
              goto LAB_001087db;
            }
            pEVar12 = (ENetIncomingCommand *)(pEVar12->incomingCommandList).previous;
          } while( true );
        }
      }
    }
  }
  return -1;
}

Assistant:

static int enet_protocol_handle_send_fragment(ENetHost *host, ENetPeer *peer, const ENetProtocol *command, enet_uint8 **currentData) {
        enet_uint32 fragmentNumber, fragmentCount, fragmentOffset, fragmentLength, startSequenceNumber, totalLength;
        ENetChannel *channel;
        enet_uint16 startWindow, currentWindow;
        ENetListIterator currentCommand;
        ENetIncomingCommand *startCommand = NULL;

        if (command->header.channelID >= peer->channelCount || (peer->state != ENET_PEER_STATE_CONNECTED && peer->state != ENET_PEER_STATE_DISCONNECT_LATER)) {
            return -1;
        }

        fragmentLength = ENET_NET_TO_HOST_16(command->sendFragment.dataLength);
        *currentData  += fragmentLength;
        if (fragmentLength <= 0 ||
            fragmentLength > host->maximumPacketSize ||
            *currentData < host->receivedData ||
            *currentData > &host->receivedData[host->receivedDataLength]
        ) {
            return -1;
        }

        channel = &peer->channels[command->header.channelID];
        startSequenceNumber = ENET_NET_TO_HOST_16(command->sendFragment.startSequenceNumber);
        startWindow         = startSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
        currentWindow       = channel->incomingReliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;

        if (startSequenceNumber < channel->incomingReliableSequenceNumber) {
            startWindow += ENET_PEER_RELIABLE_WINDOWS;
        }

        if (startWindow < currentWindow || startWindow >= currentWindow + ENET_PEER_FREE_RELIABLE_WINDOWS - 1) {
            return 0;
        }

        fragmentNumber = ENET_NET_TO_HOST_32(command->sendFragment.fragmentNumber);
        fragmentCount  = ENET_NET_TO_HOST_32(command->sendFragment.fragmentCount);
        fragmentOffset = ENET_NET_TO_HOST_32(command->sendFragment.fragmentOffset);
        totalLength    = ENET_NET_TO_HOST_32(command->sendFragment.totalLength);

        if (fragmentCount > ENET_PROTOCOL_MAXIMUM_FRAGMENT_COUNT ||
            fragmentNumber >= fragmentCount ||
            totalLength > host->maximumPacketSize ||
            totalLength < fragmentCount ||
            fragmentOffset >= totalLength ||
            fragmentLength > totalLength - fragmentOffset
        ) {
            return -1;
        }

        for (currentCommand = enet_list_previous(enet_list_end(&channel->incomingReliableCommands));
            currentCommand != enet_list_end(&channel->incomingReliableCommands);
            currentCommand = enet_list_previous(currentCommand)
        ) {
            ENetIncomingCommand *incomingCommand = (ENetIncomingCommand *) currentCommand;

            if (startSequenceNumber >= channel->incomingReliableSequenceNumber) {
                if (incomingCommand->reliableSequenceNumber < channel->incomingReliableSequenceNumber) {
                    continue;
                }
            } else if (incomingCommand->reliableSequenceNumber >= channel->incomingReliableSequenceNumber) {
                break;
            }

            if (incomingCommand->reliableSequenceNumber <= startSequenceNumber) {
                if (incomingCommand->reliableSequenceNumber < startSequenceNumber) {
                    break;
                }

                if ((incomingCommand->command.header.command & ENET_PROTOCOL_COMMAND_MASK) !=
                    ENET_PROTOCOL_COMMAND_SEND_FRAGMENT ||
                    totalLength != incomingCommand->packet->dataLength ||
                    fragmentCount != incomingCommand->fragmentCount
                ) {
                    return -1;
                }

                startCommand = incomingCommand;
                break;
            }
        }

        if (startCommand == NULL) {
            ENetProtocol hostCommand = *command;
            hostCommand.header.reliableSequenceNumber = startSequenceNumber;
            startCommand = enet_peer_queue_incoming_command(peer, &hostCommand, NULL, totalLength, ENET_PACKET_FLAG_RELIABLE, fragmentCount);
            if (startCommand == NULL) {
                return -1;
            }
        }

        if ((startCommand->fragments[fragmentNumber / 32] & (1u << (fragmentNumber % 32))) == 0) {
            --startCommand->fragmentsRemaining;
            startCommand->fragments[fragmentNumber / 32] |= (1u << (fragmentNumber % 32));

            if (fragmentOffset + fragmentLength > startCommand->packet->dataLength) {
                fragmentLength = startCommand->packet->dataLength - fragmentOffset;
            }

            memcpy(startCommand->packet->data + fragmentOffset, (enet_uint8 *) command + sizeof(ENetProtocolSendFragment), fragmentLength);

            if (startCommand->fragmentsRemaining <= 0) {
                enet_peer_dispatch_incoming_reliable_commands(peer, channel, NULL);
            }
        }

        return 0;
    }